

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::DtlsSession::Write
          (Error *__return_storage_ptr__,DtlsSession *this,ByteArray *aBuf,MessageSubType aSubType)

{
  uchar *buf;
  long lVar1;
  long lVar2;
  char *pcVar3;
  uint aMbedtlsError;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  ByteArray *extraout_RDX;
  ByteArray *extraout_RDX_00;
  ByteArray *extraout_RDX_01;
  ByteArray *aBytes;
  char *pcVar5;
  char *pcVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar7;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  format_args args_01;
  writer write;
  string local_f0;
  utils *local_d0;
  undefined1 local_c8 [8];
  char *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined1 local_a0 [32];
  DtlsSession *local_80;
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  pointer local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *pfStack_50;
  code *local_48;
  code *pcStack_40;
  code *local_38;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  if (this->mState == kConnected) {
    ((this->mSocket).super___shared_ptr<ot::commissioner::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    )->mSubType = aSubType;
    buf = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start;
    aMbedtlsError =
         mbedtls_ssl_write(&this->mSsl,buf,
                           (long)(aBuf->
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                 _M_impl.super__Vector_impl_data._M_finish - (long)buf);
    ((this->mSocket).super___shared_ptr<ot::commissioner::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    )->mSubType = kNone;
    if ((int)aMbedtlsError < 0) {
      ErrorFromMbedtlsError((Error *)local_78,aMbedtlsError);
      __return_storage_ptr__->mCode = local_78._0_4_;
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->mMessage,(string *)&local_70);
      paVar4 = &local_60;
      local_f0._M_dataplus._M_p = local_70._M_p;
      goto LAB_001e5b7f;
    }
    local_d0 = (utils *)aBuf;
    if ((DtlsSession *)
        ((aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_finish +
        -(long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start) == (DtlsSession *)(ulong)aMbedtlsError) {
      local_c8 = (undefined1  [8])&local_b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"dtls","");
      local_78 = (undefined1  [8])0x40000000e;
      local_70._M_p._0_4_ = 0xd;
      pcVar5 = "session(={}) successfully write data: len={}, {}";
      local_68 = "session(={}) successfully write data: len={}, {}";
      local_60._M_allocated_capacity = 0x30;
      local_60._8_8_ = 0x300000000;
      local_48 = ::fmt::v10::detail::
                 parse_format_specs<void*,fmt::v10::detail::compile_parse_context<char>>;
      pcStack_40 = ::fmt::v10::detail::
                   parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
      local_38 = ::fmt::v10::detail::
                 parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      aBytes = extraout_RDX;
      local_a0._0_8_ =
           (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)local_78;
      pfStack_50 = (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
                   local_78;
      do {
        if (pcVar5 == "") break;
        pcVar6 = pcVar5;
        if (*pcVar5 == '{') {
LAB_001e57e8:
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()((writer *)local_a0,pcVar5,pcVar6);
          pcVar5 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,void*,unsigned_long,std::__cxx11::string>&>
                             (pcVar6,"",
                              (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long>
                               *)local_78);
          bVar7 = true;
          aBytes = extraout_RDX_00;
        }
        else {
          pcVar6 = pcVar5 + 1;
          bVar7 = pcVar6 != "";
          if (bVar7) {
            if (*pcVar6 != '{') {
              pcVar3 = pcVar5 + 2;
              do {
                pcVar6 = pcVar3;
                bVar7 = pcVar6 != "";
                if (pcVar6 == "") goto LAB_001e57e4;
                pcVar3 = pcVar6 + 1;
              } while (*pcVar6 != '{');
            }
            bVar7 = true;
          }
LAB_001e57e4:
          if (bVar7) goto LAB_001e57e8;
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()((writer *)local_a0,pcVar5,"");
          bVar7 = false;
          aBytes = extraout_RDX_01;
        }
      } while (bVar7);
      lVar1 = *(long *)local_d0;
      lVar2 = *(long *)(local_d0 + 8);
      utils::Hex_abi_cxx11_((string *)local_a0,local_d0,aBytes);
      local_68 = (pointer)(lVar2 - lVar1);
      local_60._8_8_ = local_a0._0_8_;
      pfStack_50 = (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
                   local_a0._8_8_;
      fmt.size_ = 0xd4e;
      fmt.data_ = (char *)0x30;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)local_78;
      local_78 = (undefined1  [8])this;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_f0,(v10 *)"session(={}) successfully write data: len={}, {}",fmt,args);
      Log(kDebug,(string *)local_c8,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if ((format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)local_a0._0_8_
          != (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
             (local_a0 + 0x10)) {
        operator_delete((void *)local_a0._0_8_);
      }
      paVar4 = &local_b8;
      local_f0._M_dataplus._M_p = (pointer)local_c8;
      goto LAB_001e5b7f;
    }
    local_78 = (undefined1  [8])0x400000001;
    pcVar5 = "written {} bytes of total length {}";
    local_70._M_p = "written {} bytes of total length {}";
    local_68 = (pointer)0x23;
    local_60._M_allocated_capacity = 0x200000000;
    pfStack_50 = (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
                 ::fmt::v10::detail::
                 parse_format_specs<int,fmt::v10::detail::compile_parse_context<char>>;
    local_48 = ::fmt::v10::detail::
               parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
    local_a0._0_8_ =
         (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)local_78;
    local_80 = (DtlsSession *)(ulong)aMbedtlsError;
    local_60._8_8_ =
         (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)local_78;
    do {
      if (pcVar5 == "") break;
      pcVar6 = pcVar5;
      if (*pcVar5 == '{') {
LAB_001e5ab1:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_int,_unsigned_long>_>
        ::writer::operator()((writer *)local_a0,pcVar5,pcVar6);
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,int,unsigned_long>&>
                           (pcVar6,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
                             *)local_78);
        bVar7 = true;
      }
      else {
        pcVar6 = pcVar5 + 1;
        bVar7 = pcVar6 != "";
        if (bVar7) {
          if (*pcVar6 != '{') {
            pcVar3 = pcVar5 + 2;
            do {
              pcVar6 = pcVar3;
              bVar7 = pcVar6 != "";
              if (pcVar6 == "") goto LAB_001e5aad;
              pcVar3 = pcVar6 + 1;
            } while (*pcVar6 != '{');
          }
          bVar7 = true;
        }
LAB_001e5aad:
        if (bVar7) goto LAB_001e5ab1;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_int,_unsigned_long>_>
        ::writer::operator()((writer *)local_a0,pcVar5,"");
        bVar7 = false;
      }
    } while (bVar7);
    local_68 = *(pointer *)(local_d0 + 8) + -*(long *)local_d0;
    local_78 = (undefined1  [8])local_80;
    fmt_00.size_ = 0x41;
    fmt_00.data_ = (char *)0x23;
    args_01.field_1.args_ = in_R9.args_;
    args_01.desc_ = (unsigned_long_long)local_78;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_f0,(v10 *)"written {} bytes of total length {}",fmt_00,args_01);
    local_c8._0_4_ = 0xc;
    local_c0 = local_b8._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,local_f0._M_dataplus._M_p,
               local_f0._M_dataplus._M_p + local_f0._M_string_length);
  }
  else {
    local_78 = (undefined1  [8])((ulong)local_78 & 0xffffffff00000000);
    pcVar5 = "the DTLS session is not connected";
    local_70._M_p = "the DTLS session is not connected";
    local_68 = (pointer)0x21;
    local_60._M_allocated_capacity = 0;
    pfStack_50 = (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)0x0;
    local_a0._0_8_ =
         (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)local_78;
    local_60._8_8_ =
         (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)local_78;
    do {
      if (pcVar5 == "") break;
      pcVar6 = pcVar5;
      if (*pcVar5 == '{') {
LAB_001e5941:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()((writer *)local_a0,pcVar5,pcVar6);
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar6,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_78);
        bVar7 = true;
      }
      else {
        pcVar6 = pcVar5 + 1;
        bVar7 = pcVar6 != "";
        if (bVar7) {
          if (*pcVar6 != '{') {
            pcVar3 = pcVar5 + 2;
            do {
              pcVar6 = pcVar3;
              bVar7 = pcVar6 != "";
              if (pcVar6 == "") goto LAB_001e593d;
              pcVar3 = pcVar6 + 1;
            } while (*pcVar6 != '{');
          }
          bVar7 = true;
        }
LAB_001e593d:
        if (bVar7) goto LAB_001e5941;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()((writer *)local_a0,pcVar5,"");
        bVar7 = false;
      }
    } while (bVar7);
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_78;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_f0,(v10 *)"the DTLS session is not connected",(string_view)ZEXT816(0x21),
               args_00);
    local_c8._0_4_ = 0xf;
    local_c0 = local_b8._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,local_f0._M_dataplus._M_p,
               local_f0._M_dataplus._M_p + local_f0._M_string_length);
  }
  __return_storage_ptr__->mCode = local_c8._0_4_;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)&local_c0);
  if (local_c0 != local_b8._M_local_buf + 8) {
    operator_delete(local_c0);
  }
  paVar4 = &local_f0.field_2;
LAB_001e5b7f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar4) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Error DtlsSession::Write(const ByteArray &aBuf, MessageSubType aSubType)
{
    int   rval = 0;
    Error error;

    VerifyOrExit(mState == State::kConnected, error = ERROR_INVALID_STATE("the DTLS session is not connected"));

    mSocket->SetSubType(aSubType);
    rval = mbedtls_ssl_write(&mSsl, &aBuf[0], aBuf.size());
    mSocket->SetSubType(MessageSubType::kNone);

    if (rval >= 0)
    {
        VerifyOrExit(static_cast<size_t>(rval) == aBuf.size(),
                     error = ERROR_IO_BUSY("written {} bytes of total length {}", rval, aBuf.size()));

        LOG_DEBUG(LOG_REGION_DTLS, "session(={}) successfully write data: len={}, {}", static_cast<void *>(this),
                  aBuf.size(), utils::Hex(aBuf));
    }
    else
    {
        error = ErrorFromMbedtlsError(rval);
    }

exit:
    return error;
}